

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

bool __thiscall MipsParser::parseVpfxsParameter(MipsParser *this,Parser *parser,int *result)

{
  TokenValueSequence values;
  TokenSequence tokens;
  TokenValueSequence values_00;
  TokenSequence tokens_00;
  TokenValueSequence values_01;
  TokenSequence tokens_01;
  TokenValueSequence values_02;
  TokenSequence tokens_02;
  TokenValueSequence values_03;
  TokenSequence tokens_03;
  TokenValueSequence values_04;
  TokenSequence tokens_04;
  TokenValueSequence values_05;
  TokenSequence tokens_05;
  TokenValueSequence values_06;
  TokenSequence tokens_06;
  char *__s;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  Token *pTVar4;
  Identifier *this_00;
  long lVar5;
  char *pcVar6;
  uint local_27c;
  string *psStack_278;
  int constNum;
  string *stringValue;
  char *reg;
  Token *token;
  Token *pTStack_258;
  bool abs;
  Token *tokenFinder;
  undefined1 local_248 [4];
  int i;
  TokenSequenceValue TStack_238;
  iterator local_228;
  undefined8 local_220;
  TokenType local_214 [3];
  iterator local_208;
  size_type local_200;
  TokenSequenceValue local_1f8;
  TokenSequenceValue TStack_1e8;
  iterator local_1d8;
  undefined8 local_1d0;
  TokenType local_1c4 [3];
  iterator local_1b8;
  size_type local_1b0;
  TokenSequenceValue local_1a8;
  TokenSequenceValue TStack_198;
  iterator local_188;
  undefined8 local_180;
  TokenType local_174 [3];
  iterator local_168;
  size_type local_160;
  TokenSequenceValue local_158;
  iterator local_148;
  undefined8 local_140;
  TokenType local_134;
  iterator local_130;
  size_type local_128;
  TokenSequenceValue local_120;
  TokenSequenceValue TStack_110;
  iterator local_100;
  undefined8 local_f8;
  TokenType local_ec [3];
  iterator local_e0;
  size_type local_d8;
  TokenSequenceValue local_d0;
  iterator local_c0;
  undefined8 local_b8;
  TokenType local_ac;
  iterator local_a8;
  size_type local_a0;
  TokenSequenceValue local_98;
  iterator local_88;
  undefined8 local_80;
  TokenType local_74;
  iterator local_70;
  size_type local_68;
  TokenSequenceValue local_60;
  iterator local_50;
  undefined8 local_48;
  TokenType local_3c;
  iterator local_38;
  size_type local_30;
  uint *local_28;
  int *result_local;
  Parser *parser_local;
  MipsParser *this_local;
  
  local_28 = (uint *)result;
  result_local = (int *)parser;
  parser_local = (Parser *)this;
  if ((parseVpfxsParameter(Parser&,int&)::sequenceParser == '\0') &&
     (iVar2 = __cxa_guard_acquire(&parseVpfxsParameter(Parser&,int&)::sequenceParser), iVar2 != 0))
  {
    TokenSequenceParser::TokenSequenceParser(&parseVpfxsParameter::sequenceParser);
    __cxa_atexit(TokenSequenceParser::~TokenSequenceParser,&parseVpfxsParameter::sequenceParser,
                 &__dso_handle);
    __cxa_guard_release(&parseVpfxsParameter(Parser&,int&)::sequenceParser);
  }
  sVar3 = TokenSequenceParser::getEntryCount(&parseVpfxsParameter::sequenceParser);
  if (sVar3 == 0) {
    local_3c = Integer;
    local_38 = &local_3c;
    local_30 = 1;
    TokenSequenceValue::TokenSequenceValue(&local_60,0);
    local_50 = &local_60;
    local_48 = 1;
    tokens_06._M_len = local_30;
    tokens_06._M_array = local_38;
    values_06._M_len = 1;
    values_06._M_array = local_50;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,0,tokens_06,values_06);
    local_74 = Integer;
    local_70 = &local_74;
    local_68 = 1;
    TokenSequenceValue::TokenSequenceValue(&local_98,1);
    local_88 = &local_98;
    local_80 = 1;
    tokens_05._M_len = local_68;
    tokens_05._M_array = local_70;
    values_05._M_len = 1;
    values_05._M_array = local_88;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,1,tokens_05,values_05);
    local_ac = Integer;
    local_a8 = &local_ac;
    local_a0 = 1;
    TokenSequenceValue::TokenSequenceValue(&local_d0,2);
    local_c0 = &local_d0;
    local_b8 = 1;
    tokens_04._M_len = local_a0;
    tokens_04._M_array = local_a8;
    values_04._M_len = 1;
    values_04._M_array = local_c0;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,2,tokens_04,values_04);
    local_ec[0] = Integer;
    local_ec[1] = 10;
    local_ec[2] = 2;
    local_e0 = local_ec;
    local_d8 = 3;
    TokenSequenceValue::TokenSequenceValue(&local_120,1);
    TokenSequenceValue::TokenSequenceValue(&TStack_110,2);
    local_100 = &local_120;
    local_f8 = 2;
    tokens_03._M_len = local_d8;
    tokens_03._M_array = local_e0;
    values_03._M_len = 2;
    values_03._M_array = local_100;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,3,tokens_03,values_03);
    local_134 = Integer;
    local_130 = &local_134;
    local_128 = 1;
    TokenSequenceValue::TokenSequenceValue(&local_158,3);
    local_148 = &local_158;
    local_140 = 1;
    tokens_02._M_len = local_128;
    tokens_02._M_array = local_130;
    values_02._M_len = 1;
    values_02._M_array = local_148;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,4,tokens_02,values_02);
    local_174[0] = Integer;
    local_174[1] = 10;
    local_174[2] = 2;
    local_168 = local_174;
    local_160 = 3;
    TokenSequenceValue::TokenSequenceValue(&local_1a8,1);
    TokenSequenceValue::TokenSequenceValue(&TStack_198,3);
    local_188 = &local_1a8;
    local_180 = 2;
    tokens_01._M_len = local_160;
    tokens_01._M_array = local_168;
    values_01._M_len = 2;
    values_01._M_array = local_188;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,5,tokens_01,values_01);
    local_1c4[0] = Integer;
    local_1c4[1] = 10;
    local_1c4[2] = 2;
    local_1b8 = local_1c4;
    local_1b0 = 3;
    TokenSequenceValue::TokenSequenceValue(&local_1f8,1);
    TokenSequenceValue::TokenSequenceValue(&TStack_1e8,4);
    local_1d8 = &local_1f8;
    local_1d0 = 2;
    tokens_00._M_len = local_1b0;
    tokens_00._M_array = local_1b8;
    values_00._M_len = 2;
    values_00._M_array = local_1d8;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,6,tokens_00,values_00);
    local_214[0] = Integer;
    local_214[1] = 10;
    local_214[2] = 2;
    local_208 = local_214;
    local_200 = 3;
    TokenSequenceValue::TokenSequenceValue((TokenSequenceValue *)local_248,1);
    TokenSequenceValue::TokenSequenceValue(&TStack_238,6);
    local_228 = (iterator)local_248;
    local_220 = 2;
    tokens._M_len = local_200;
    tokens._M_array = local_208;
    values._M_len = 2;
    values._M_array = local_228;
    TokenSequenceParser::addEntry(&parseVpfxsParameter::sequenceParser,7,tokens,values);
  }
  pTVar4 = Parser::nextToken((Parser *)result_local);
  if (pTVar4->type == LBrack) {
    for (tokenFinder._4_4_ = 0; tokenFinder._4_4_ < 4; tokenFinder._4_4_ = tokenFinder._4_4_ + 1) {
      pTStack_258 = Parser::nextToken((Parser *)result_local);
      if (tokenFinder._4_4_ != 0) {
        if (pTStack_258->type != Comma) {
          return false;
        }
        pTStack_258 = Parser::nextToken((Parser *)result_local);
      }
      if (pTStack_258->type == Minus) {
        *local_28 = 1 << ((char)tokenFinder._4_4_ + 0x10U & 0x1f) | *local_28;
        pTStack_258 = Parser::nextToken((Parser *)result_local);
      }
      token._7_1_ = 0;
      if (pTStack_258->type == BitOr) {
        *local_28 = 1 << ((char)tokenFinder._4_4_ + 8U & 0x1f) | *local_28;
        token._7_1_ = 1;
        pTStack_258 = Parser::nextToken((Parser *)result_local);
      }
      reg = (char *)pTStack_258;
      if (pTStack_258->type != Identifier) {
        return false;
      }
      this_00 = Token::identifierValue(pTStack_258);
      psStack_278 = Identifier::string_abi_cxx11_(this_00);
      lVar5 = std::__cxx11::string::size();
      __s = parseVpfxsParameter::vpfxstRegisters;
      if (lVar5 == 1) {
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)psStack_278);
        stringValue = (string *)strchr(__s,(int)*pcVar6);
        if (stringValue == (string *)0x0) goto LAB_001cf6a2;
        *local_28 = *local_28 |
                    (uint)((long)stringValue - (long)parseVpfxsParameter::vpfxstRegisters <<
                          ((byte)(tokenFinder._4_4_ << 1) & 0x3f));
        if (((token._7_1_ & 1) != 0) &&
           (pTVar4 = Parser::nextToken((Parser *)result_local), pTVar4->type != BitOr)) {
          return false;
        }
      }
      else {
LAB_001cf6a2:
        if ((token._7_1_ & 1) != 0) {
          return false;
        }
        *local_28 = 1 << ((char)tokenFinder._4_4_ + 0xcU & 0x1f) | *local_28;
        local_27c = 0xffffffff;
        bVar1 = TokenSequenceParser::parse
                          (&parseVpfxsParameter::sequenceParser,(Parser *)result_local,
                           (int *)&local_27c);
        if (!bVar1) {
          return false;
        }
        *local_28 = (local_27c & 3) << ((byte)(tokenFinder._4_4_ << 1) & 0x1f) | *local_28;
        if ((local_27c & 4) != 0) {
          *local_28 = 1 << ((char)tokenFinder._4_4_ + 8U & 0x1f) | *local_28;
        }
      }
    }
    pTVar4 = Parser::nextToken((Parser *)result_local);
    this_local._7_1_ = pTVar4->type == RBrack;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MipsParser::parseVpfxsParameter(Parser& parser, int& result)
{
	static TokenSequenceParser sequenceParser;

	// initialize on first use
	if (sequenceParser.getEntryCount() == 0)
	{
		// 0
		sequenceParser.addEntry(0, {TokenType::Integer}, {INT64_C(0)} );
		// 1
		sequenceParser.addEntry(1, {TokenType::Integer}, {INT64_C(1)} );
		// 2
		sequenceParser.addEntry(2, {TokenType::Integer}, {INT64_C(2)} );
		// 1/2
		sequenceParser.addEntry(3, {TokenType::Integer, TokenType::Div, TokenType::Integer}, {INT64_C(1), INT64_C(2)} );
		// 3
		sequenceParser.addEntry(4, {TokenType::Integer}, {INT64_C(3)} );
		// 1/3
		sequenceParser.addEntry(5, {TokenType::Integer, TokenType::Div, TokenType::Integer}, {INT64_C(1), INT64_C(3)} );
		// 1/4
		sequenceParser.addEntry(6, {TokenType::Integer, TokenType::Div, TokenType::Integer}, {INT64_C(1), INT64_C(4)} );
		// 1/6
		sequenceParser.addEntry(7, {TokenType::Integer, TokenType::Div, TokenType::Integer}, {INT64_C(1), INT64_C(6)} );
	}

	if (parser.nextToken().type != TokenType::LBrack)
		return false;
	
	for (int i = 0; i < 4; i++)
	{
		const Token *tokenFinder = &parser.nextToken();

		if (i != 0)
		{
			if (tokenFinder->type != TokenType::Comma)
				return false;

			tokenFinder = &parser.nextToken();
		}
		
		// negation
		if (tokenFinder->type == TokenType::Minus)
		{
			result |= 1 << (16+i);
			tokenFinder = &parser.nextToken();
		}

		// abs
		bool abs = false;
		if (tokenFinder->type == TokenType::BitOr)
		{
			result |= 1 << (8+i);
			abs = true;
			tokenFinder = &parser.nextToken();
		}

		const Token& token = *tokenFinder;
		if (token.type != TokenType::Identifier)
			return false;

		// check for register
		const char* reg;
		static const char* vpfxstRegisters = "xyzw";
		const std::string &stringValue = token.identifierValue().string();
		if (stringValue.size() == 1 && (reg = strchr(vpfxstRegisters,stringValue[0])) != nullptr)
		{
			result |= (reg-vpfxstRegisters) << (i*2);

			if (abs && parser.nextToken().type != TokenType::BitOr)
				return false;

			continue;
		}
		
		// abs is invalid with constants
		if (abs)
			return false;

		result |= 1 << (12+i);

		int constNum = -1;
		if (!sequenceParser.parse(parser,constNum))
			return false;
		
		result |= (constNum & 3) << (i*2);
		if (constNum & 4)
			result |= 1 << (8+i);
	}

	return parser.nextToken().type == TokenType::RBrack;
}